

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_br_fillup(lzx_stream *strm,lzx_br *br)

{
  uchar *puVar1;
  uint64_t uVar2;
  uint16_t uVar3;
  int iVar4;
  int local_24;
  wchar_t n;
  lzx_br *br_local;
  lzx_stream *strm_local;
  
  local_24 = 0x40 - br->cache_avail;
  do {
    iVar4 = local_24 >> 4;
    if (iVar4 == 0) {
      return L'\x01';
    }
    if (iVar4 == 3) {
      if (5 < strm->avail_in) {
        br->cache_buffer =
             br->cache_buffer << 0x30 | (ulong)strm->next_in[1] << 0x28 |
             (ulong)*strm->next_in << 0x20 | (ulong)strm->next_in[3] << 0x18 |
             (ulong)strm->next_in[2] << 0x10 | (ulong)strm->next_in[5] << 8 |
             (ulong)strm->next_in[4];
        strm->next_in = strm->next_in + 6;
        strm->avail_in = strm->avail_in + -6;
        br->cache_avail = br->cache_avail + L'0';
        return L'\x01';
      }
    }
    else if ((iVar4 == 4) && (7 < strm->avail_in)) {
      br->cache_buffer =
           (ulong)strm->next_in[1] << 0x38 | (ulong)*strm->next_in << 0x30 |
           (ulong)strm->next_in[3] << 0x28 | (ulong)strm->next_in[2] << 0x20 |
           (ulong)strm->next_in[5] << 0x18 | (ulong)strm->next_in[4] << 0x10 |
           (ulong)strm->next_in[7] << 8 | (ulong)strm->next_in[6];
      strm->next_in = strm->next_in + 8;
      strm->avail_in = strm->avail_in + -8;
      br->cache_avail = br->cache_avail + L'@';
      return L'\x01';
    }
    if (strm->avail_in < 2) {
      if (strm->avail_in == 1) {
        puVar1 = strm->next_in;
        strm->next_in = puVar1 + 1;
        br->odd = *puVar1;
        strm->avail_in = strm->avail_in + -1;
        br->have_odd = '\x01';
      }
      return L'\0';
    }
    uVar2 = br->cache_buffer;
    uVar3 = archive_le16dec(strm->next_in);
    br->cache_buffer = uVar2 << 0x10 | (ulong)uVar3;
    strm->next_in = strm->next_in + 2;
    strm->avail_in = strm->avail_in + -2;
    br->cache_avail = br->cache_avail + L'\x10';
    local_24 = local_24 + -0x10;
  } while( true );
}

Assistant:

static int
lzx_br_fillup(struct lzx_stream *strm, struct lzx_br *br)
{
/*
 * x86 processor family can read misaligned data without an access error.
 */
	int n = CACHE_BITS - br->cache_avail;

	for (;;) {
		switch (n >> 4) {
		case 4:
			if (strm->avail_in >= 8) {
				br->cache_buffer =
				    ((uint64_t)strm->next_in[1]) << 56 |
				    ((uint64_t)strm->next_in[0]) << 48 |
				    ((uint64_t)strm->next_in[3]) << 40 |
				    ((uint64_t)strm->next_in[2]) << 32 |
				    ((uint32_t)strm->next_in[5]) << 24 |
				    ((uint32_t)strm->next_in[4]) << 16 |
				    ((uint32_t)strm->next_in[7]) << 8 |
				     (uint32_t)strm->next_in[6];
				strm->next_in += 8;
				strm->avail_in -= 8;
				br->cache_avail += 8 * 8;
				return (1);
			}
			break;
		case 3:
			if (strm->avail_in >= 6) {
				br->cache_buffer =
		 		   (br->cache_buffer << 48) |
				    ((uint64_t)strm->next_in[1]) << 40 |
				    ((uint64_t)strm->next_in[0]) << 32 |
				    ((uint32_t)strm->next_in[3]) << 24 |
				    ((uint32_t)strm->next_in[2]) << 16 |
				    ((uint32_t)strm->next_in[5]) << 8 |
				     (uint32_t)strm->next_in[4];
				strm->next_in += 6;
				strm->avail_in -= 6;
				br->cache_avail += 6 * 8;
				return (1);
			}
			break;
		case 0:
			/* We have enough compressed data in
			 * the cache buffer.*/
			return (1);
		default:
			break;
		}
		if (strm->avail_in < 2) {
			/* There is not enough compressed data to
			 * fill up the cache buffer. */
			if (strm->avail_in == 1) {
				br->odd = *strm->next_in++;
				strm->avail_in--;
				br->have_odd = 1;
			}
			return (0);
		}
		br->cache_buffer =
		   (br->cache_buffer << 16) |
		    archive_le16dec(strm->next_in);
		strm->next_in += 2;
		strm->avail_in -= 2;
		br->cache_avail += 16;
		n -= 16;
	}
}